

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.hpp
# Opt level: O0

void mcts::MCTS_<ttt::Board,mcts::RandomPlayout<ttt::Board>>
               (MCTSNode *root,Board *root_game,mt19937 *gen)

{
  initializer_list<mcts::MCTSNode_*> __l;
  IPlayer IVar1;
  bool bVar2;
  int iVar3;
  result_type_conflict1 rVar4;
  size_type sVar5;
  reference pvVar6;
  MCTSNode *pMVar7;
  pointer ppVar8;
  ulong uVar9;
  size_type sVar10;
  reference ppMVar11;
  Board *in_RSI;
  MCTSNode *in_RDI;
  double dVar12;
  pair<std::__detail::_Node_iterator<std::pair<const_long,_mcts::MCTSNode_*>,_false,_false>,_bool>
  pVar13;
  uint i;
  int status;
  MCTSNode *new_node;
  iterator it_1;
  value_type m;
  vector<long,_std::allocator<long>_> moves;
  double p;
  pair<const_long,_mcts::MCTSNode_*> *it;
  iterator __end3;
  iterator __begin3;
  unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
  *__range3;
  IMove move;
  double min;
  MCTSNode *child;
  vector<mcts::MCTSNode_*,_std::allocator<mcts::MCTSNode_*>_> nodes;
  int player;
  Board game;
  MCTSNode *node;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  MCTSNode *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  _Node_iterator_base<std::pair<const_long,_mcts::MCTSNode_*>,_false> in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  vector<mcts::MCTSNode_*,_std::allocator<mcts::MCTSNode_*>_> *in_stack_fffffffffffffea0;
  Board *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  Board *game_00;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  uint uVar14;
  vector<long,_std::allocator<long>_> local_118;
  MCTSNode *local_100;
  _Node_iterator_base<std::pair<const_long,_mcts::MCTSNode_*>,_false> local_f8;
  _Node_iterator_base<std::pair<const_long,_mcts::MCTSNode_*>,_false> local_f0 [2];
  value_type local_e0;
  vector<long,_std::allocator<long>_> local_d8;
  double local_c0;
  reference local_b8;
  _Node_iterator_base<std::pair<const_long,_mcts::MCTSNode_*>,_false> local_b0;
  _Node_iterator_base<std::pair<const_long,_mcts::MCTSNode_*>,_false> local_a8;
  unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
  *local_a0;
  long local_98;
  double local_90;
  MCTSNode *local_88;
  undefined1 local_69;
  MCTSNode *local_68;
  MCTSNode **local_60;
  undefined8 local_58;
  vector<mcts::MCTSNode_*,_std::allocator<mcts::MCTSNode_*>_> local_50;
  int local_34;
  undefined8 local_30;
  undefined2 local_28;
  MCTSNode *local_20;
  MCTSNode *local_8;
  
  local_28 = *(undefined2 *)((in_RSI->board)._M_elems[2]._M_elems + 2);
  local_30 = *(undefined8 *)(in_RSI->board)._M_elems;
  local_20 = in_RDI;
  local_8 = in_RDI;
  IVar1 = ttt::Board::GetPlayerToMove(in_RSI);
  local_34 = 3 - IVar1;
  local_68 = local_8;
  local_60 = &local_68;
  local_58 = 1;
  game_00 = (Board *)&local_69;
  std::allocator<mcts::MCTSNode_*>::allocator((allocator<mcts::MCTSNode_*> *)0x1ef2ba);
  __l._M_len._0_4_ = in_stack_fffffffffffffeb0;
  __l._M_array = (iterator)in_stack_fffffffffffffea8;
  __l._M_len._4_4_ = in_stack_fffffffffffffeb4;
  std::vector<mcts::MCTSNode_*,_std::allocator<mcts::MCTSNode_*>_>::vector
            (in_stack_fffffffffffffea0,__l,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  std::allocator<mcts::MCTSNode_*>::~allocator((allocator<mcts::MCTSNode_*> *)0x1ef2eb);
  while ((iVar3 = ttt::Board::GetStatus((Board *)0x1ef2fa), iVar3 == -1 &&
         (sVar5 = std::
                  unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
                  ::size((unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
                          *)0x1ef35e), local_20->move_count <= (int)sVar5))) {
    local_88 = (MCTSNode *)0x0;
    local_90 = 0.0;
    local_98 = -1;
    local_a0 = &local_20->children;
    local_a8._M_cur =
         (__node_type *)
         std::
         unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
         ::begin((unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_b0._M_cur =
         (__node_type *)
         std::
         unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
         ::end((unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
                *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    while (bVar2 = std::__detail::operator!=(&local_a8,&local_b0), bVar2) {
      local_b8 = std::__detail::
                 _Node_iterator<std::pair<const_long,_mcts::MCTSNode_*>,_false,_false>::operator*
                           ((_Node_iterator<std::pair<const_long,_mcts::MCTSNode_*>,_false,_false> *
                            )0x1ef3fd);
      dVar12 = local_b8->second->value / (double)local_b8->second->total;
      in_stack_fffffffffffffea8 = (Board *)std::log<long_long>(0x1ef436);
      local_c0 = sqrt(((double)in_stack_fffffffffffffea8 * 2.0) / (double)local_b8->second->total);
      local_c0 = dVar12 + local_c0;
      if ((local_90 < local_c0) || (local_88 == (MCTSNode *)0x0)) {
        local_98 = local_b8->first;
        local_88 = local_b8->second;
        local_90 = local_c0;
      }
      std::__detail::_Node_iterator<std::pair<const_long,_mcts::MCTSNode_*>,_false,_false>::
      operator++((_Node_iterator<std::pair<const_long,_mcts::MCTSNode_*>,_false,_false> *)
                 in_stack_fffffffffffffe70);
    }
    local_20 = local_88;
    std::vector<mcts::MCTSNode_*,_std::allocator<mcts::MCTSNode_*>_>::push_back
              ((vector<mcts::MCTSNode_*,_std::allocator<mcts::MCTSNode_*>_> *)
               in_stack_fffffffffffffe80._M_cur,
               (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    ttt::Board::ApplyMove
              ((Board *)in_stack_fffffffffffffe80._M_cur,
               (IMove *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  }
  iVar3 = ttt::Board::GetStatus((Board *)0x1ef53d);
  if (iVar3 == -1) {
    ttt::Board::GetPossibleMoves(in_stack_fffffffffffffea8);
    std::vector<long,_std::allocator<long>_>::size(&local_d8);
    std::uniform_int_distribution<int>::uniform_int_distribution
              ((uniform_int_distribution<int> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
               in_stack_fffffffffffffe68);
    rVar4 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)in_stack_fffffffffffffe70,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](&local_d8,(long)rVar4);
    local_e0 = *pvVar6;
    local_f0[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
         ::find((unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                (key_type *)0x1ef5dc);
    local_f8._M_cur =
         (__node_type *)
         std::
         unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
         ::end((unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
                *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    bVar2 = std::__detail::operator==(local_f0,&local_f8);
    if (bVar2) {
      ttt::Board::ApplyMove
                ((Board *)in_stack_fffffffffffffe80._M_cur,
                 (IMove *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      pMVar7 = (MCTSNode *)operator_new(0x50);
      ttt::Board::GetPossibleMoves(in_stack_fffffffffffffea8);
      std::vector<long,_std::allocator<long>_>::size(&local_118);
      MCTSNode::MCTSNode(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe80._M_cur);
      local_100 = pMVar7;
      pVar13 = std::
               unordered_map<long,mcts::MCTSNode*,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,mcts::MCTSNode*>>>
               ::emplace<long&,mcts::MCTSNode*&>
                         ((unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
                           *)in_stack_fffffffffffffe80._M_cur,
                          (long *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                          (MCTSNode **)in_stack_fffffffffffffe70);
      in_stack_fffffffffffffe80._M_cur =
           (__node_type *)
           pVar13.first.super__Node_iterator_base<std::pair<const_long,_mcts::MCTSNode_*>,_false>.
           _M_cur;
      in_stack_fffffffffffffe7c = CONCAT13(pVar13.second,(int3)in_stack_fffffffffffffe7c);
      local_20 = local_100;
    }
    else {
      ppVar8 = std::__detail::_Node_iterator<std::pair<const_long,_mcts::MCTSNode_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_long,_mcts::MCTSNode_*>,_false,_false> *
                            )0x1ef767);
      local_20 = ppVar8->second;
    }
    std::vector<mcts::MCTSNode_*,_std::allocator<mcts::MCTSNode_*>_>::push_back
              ((vector<mcts::MCTSNode_*,_std::allocator<mcts::MCTSNode_*>_> *)
               in_stack_fffffffffffffe80._M_cur,
               (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe80._M_cur);
  }
  iVar3 = RandomPlayout<ttt::Board>::operator()
                    ((RandomPlayout<ttt::Board> *)
                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),game_00);
  uVar14 = 0;
  while( true ) {
    uVar9 = (ulong)uVar14;
    sVar10 = std::vector<mcts::MCTSNode_*,_std::allocator<mcts::MCTSNode_*>_>::size(&local_50);
    if (sVar10 <= uVar9) break;
    ppMVar11 = std::vector<mcts::MCTSNode_*,_std::allocator<mcts::MCTSNode_*>_>::operator[]
                         (&local_50,(ulong)uVar14);
    (*ppMVar11)->total = (*ppMVar11)->total + 1;
    if (local_34 == iVar3) {
      ppMVar11 = std::vector<mcts::MCTSNode_*,_std::allocator<mcts::MCTSNode_*>_>::operator[]
                           (&local_50,(ulong)uVar14);
      (*ppMVar11)->value = (*ppMVar11)->value + 1.0;
    }
    else if (iVar3 == 0) {
      ppMVar11 = std::vector<mcts::MCTSNode_*,_std::allocator<mcts::MCTSNode_*>_>::operator[]
                           (&local_50,(ulong)uVar14);
      (*ppMVar11)->value = (*ppMVar11)->value + 0.5;
    }
    uVar14 = uVar14 + 1;
    local_34 = 3 - local_34;
  }
  std::vector<mcts::MCTSNode_*,_std::allocator<mcts::MCTSNode_*>_>::~vector
            ((vector<mcts::MCTSNode_*,_std::allocator<mcts::MCTSNode_*>_> *)
             in_stack_fffffffffffffe80._M_cur);
  return;
}

Assistant:

static void
MCTS_(MCTSNode *root, const IGame &root_game, std::mt19937 &gen)
{
    MCTSNode *node = root;
    auto game = root_game;
    auto player = 3 - root_game.GetPlayerToMove();
    std::vector<MCTSNode *> nodes = {root};
    while (true)
    {
        if (game.GetStatus() != game::Undecided)
            break;
        if (int(node->children.size()) < node->move_count)
            break;

        MCTSNode *child = nullptr;
        double min = 0.0;
        game::IMove move = -1;
        for (const auto &it : node->children)
        {
            double p = static_cast<double>(it.second->value) / it.second->total + std::sqrt(2.0 * std::log(node->total) / it.second->total);
            if (p > min || child == nullptr)
            {
                min = p;
                move = it.first;
                child = it.second;
            }
        }
        node = child;
        nodes.push_back(node);
        game.ApplyMove(move);
    }

    if (game.GetStatus() == game::Undecided)
    {
        auto moves = game.GetPossibleMoves();
        auto m = moves[std::uniform_int_distribution<>(0, moves.size() - 1)(gen)];
        auto it = node->children.find(m);
        if (it == node->children.end())
        {
            game.ApplyMove(m);
            auto new_node = new MCTSNode(game.GetPossibleMoves().size());
            node->children.emplace(m, new_node);
            node = new_node;
        }
        else
            node = it->second;
        nodes.push_back(node);
    }

    int status = RandomPlayout()(game);

    for (unsigned i = 0; i < nodes.size(); ++i, player = 3 - player)
    {
        ++nodes[i]->total;
        if (player == status)
            nodes[i]->value += 1.0;
        else if (status == game::Draw)
            nodes[i]->value += 0.5;
    }
}